

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

MPP_RET mpp_buf_slot_default_info(MppBufSlots slots,RK_S32 index,void *val)

{
  MppBufSlotEntry *slot_00;
  MppFrame *frame;
  MppBufSlotEntry *slot;
  AutoMutex auto_lock;
  MppBufSlotsImpl *impl;
  void *val_local;
  RK_S32 index_local;
  MppBufSlots slots_local;
  
  if ((slots == (MppBufSlots)0x0) || (index < 0)) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_default_info");
    slots_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    auto_lock.mLock = (Mutex *)slots;
    Mutex::Autolock::Autolock((Autolock *)&slot,*slots,1);
    if ((index < 0) || (auto_lock.mLock[2].mMutex.__data.__kind <= index)) {
      _dump_slots("mpp_buf_slot_default_info",(MppBufSlotsImpl *)auto_lock.mLock);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(index >= 0) && (index < impl->buf_count)","mpp_buf_slot_default_info",0x508);
      abort();
    }
    slot_00 = (MppBufSlotEntry *)
              ((long)auto_lock.mLock[5].mMutex.__data.__list.__next + (long)index * 0x38);
    if (((slot_00->status).val >> 1 & 1) == 0) {
      _dump_slots("mpp_buf_slot_default_info",(MppBufSlotsImpl *)auto_lock.mLock);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "slot->status.not_ready","mpp_buf_slot_default_info",0x50b);
      abort();
    }
    if (slot_00->frame != (MppFrame)0x0) {
      _dump_slots("mpp_buf_slot_default_info",(MppBufSlotsImpl *)auto_lock.mLock);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "__null == slot->frame","mpp_buf_slot_default_info",0x50c);
      abort();
    }
    if (auto_lock.mLock[3].mMutex.__data.__list.__next == (__pthread_internal_list *)0x0) {
      _dump_slots("mpp_buf_slot_default_info",(MppBufSlotsImpl *)auto_lock.mLock);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,"impl->info_set",
                 "mpp_buf_slot_default_info",0x50d);
      abort();
    }
    if (slot_00->frame == (MppFrame)0x0) {
      mpp_frame_init(&slot_00->frame);
      mpp_frame_copy(slot_00->frame,auto_lock.mLock[3].mMutex.__data.__list.__next);
    }
    *(MppFrame *)val = slot_00->frame;
    slot_ops_with_log((MppBufSlotsImpl *)auto_lock.mLock,slot_00,SLOT_CLR_NOT_READY,(void *)0x0);
    slot_ops_with_log((MppBufSlotsImpl *)auto_lock.mLock,slot_00,SLOT_SET_FRAME,slot_00->frame);
    slots_local._4_4_ = MPP_OK;
    Mutex::Autolock::~Autolock((Autolock *)&slot);
  }
  return slots_local._4_4_;
}

Assistant:

MPP_RET mpp_buf_slot_default_info(MppBufSlots slots, RK_S32 index, void *val)
{
    if (NULL == slots || index < 0) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    slot_assert(impl, (index >= 0) && (index < impl->buf_count));
    MppBufSlotEntry *slot = &impl->slots[index];

    slot_assert(impl, slot->status.not_ready);
    slot_assert(impl, NULL == slot->frame);
    slot_assert(impl, impl->info_set);

    if (NULL == slot->frame) {
        mpp_frame_init(&slot->frame);
        mpp_frame_copy(slot->frame, impl->info_set);
    }

    MppFrame *frame = (MppFrame *)val;
    *frame = slot->frame;

    slot_ops_with_log(impl, slot, SLOT_CLR_NOT_READY, NULL);
    slot_ops_with_log(impl, slot, SLOT_SET_FRAME, slot->frame);
    return MPP_OK;
}